

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

int OSSL_HTTP_REQ_CTX_set1_req
              (OSSL_HTTP_REQ_CTX *rctx,char *content_type,ASN1_ITEM *it,ASN1_VALUE *req)

{
  int iVar1;
  long in_RCX;
  int res;
  BIO *mem;
  BIO *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar2;
  uint uVar3;
  OSSL_HTTP_REQ_CTX *rctx_00;
  
  rctx_00 = (OSSL_HTTP_REQ_CTX *)0x0;
  uVar3 = 1;
  if (in_RCX != 0) {
    rctx_00 = (OSSL_HTTP_REQ_CTX *)
              ASN1_item_i2d_mem_bio
                        ((ASN1_ITEM *)0x0,(ASN1_VALUE *)CONCAT44(1,in_stack_ffffffffffffffd0));
    uVar3 = (uint)(rctx_00 != (OSSL_HTTP_REQ_CTX *)0x0);
  }
  uVar2 = 0;
  if (uVar3 != 0) {
    iVar1 = set1_content(rctx_00,(char *)(CONCAT44(uVar3,in_stack_ffffffffffffffd0) &
                                         0xffffffff00ffffff),in_stack_ffffffffffffffc8);
    uVar2 = (uint)(iVar1 != 0) << 0x18;
  }
  uVar2 = uVar2 >> 0x18;
  BIO_free((BIO *)rctx_00);
  return uVar2;
}

Assistant:

int OSSL_HTTP_REQ_CTX_set1_req(OSSL_HTTP_REQ_CTX *rctx, const char *content_type,
                               const ASN1_ITEM *it, const ASN1_VALUE *req)
{
    BIO *mem = NULL;
    int res = 1;

    if (req != NULL)
        res = (mem = ASN1_item_i2d_mem_bio(it, req)) != NULL;
    res = res && set1_content(rctx, content_type, mem);
    BIO_free(mem);
    return res;
}